

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Svd.h
# Opt level: O1

USV * singular::Svd<60,_50>::decomposeUSV(USV *__return_storage_ptr__,Matrix<60,_50> *m)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int i_1;
  Matrix<60,_60> __s;
  Matrix<50,_50> __s_00;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  double *__dest;
  double *pdVar7;
  int j;
  long lVar8;
  int j_1;
  int i;
  int n;
  int iVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  Matrix<50,_50> v;
  Matrix<60,_60> u;
  BidiagonalMatrix m2;
  int shuffle [60];
  double ss [50];
  double ss2 [60];
  _Head_base<2UL,_singular::Matrix<50,_50>,_false> local_4c0;
  _Head_base<0UL,_singular::Matrix<60,_60>,_false> local_4b8;
  BidiagonalMatrix local_4b0;
  Matrix<60,_50> local_4a8;
  double local_4a0;
  int local_498 [60];
  double local_3a8 [50];
  double local_218 [61];
  
  __s.pBlock = (double *)operator_new__(0x7080);
  lVar10 = 0;
  local_4b8._M_head_impl.pBlock = (Matrix<60,_60>)(Matrix<60,_60>)__s.pBlock;
  memset(__s.pBlock,0,0x7080);
  do {
    *(undefined8 *)((long)__s.pBlock + lVar10) = 0x3ff0000000000000;
    lVar10 = lVar10 + 0x1e8;
  } while ((int)lVar10 != 0x7260);
  __s_00.pBlock = (double *)operator_new__(20000);
  lVar10 = 0;
  local_4c0._M_head_impl.pBlock = (Matrix<50,_50>)(Matrix<50,_50>)__s_00.pBlock;
  memset(__s_00.pBlock,0,20000);
  do {
    *(undefined8 *)((long)__s_00.pBlock + lVar10) = 0x3ff0000000000000;
    lVar10 = lVar10 + 0x198;
  } while ((int)lVar10 != 0x4fb0);
  pdVar4 = (double *)operator_new__(24000);
  memmove(pdVar4,m->pBlock,24000);
  local_4a8.pBlock = pdVar4;
  bidiagonalize((Svd<60,_50> *)&local_4b0,&local_4b8._M_head_impl,&local_4a8,&local_4c0._M_head_impl
               );
  if (local_4a8.pBlock != (double *)0x0) {
    operator_delete__(local_4a8.pBlock);
  }
  local_4a8.pBlock = (double *)0x0;
  iVar9 = 0;
  n = 0x32;
  do {
    if (n < 2) break;
    iVar1 = n + -1;
    dVar12 = BidiagonalMatrix::operator()(&local_4b0,iVar1,iVar1);
    bVar2 = true;
    if (((dVar12 != 0.0) || (NAN(dVar12))) &&
       (local_4a0 = dVar12, dVar12 = BidiagonalMatrix::operator()(&local_4b0,n + -2,iVar1),
       1e-15 <= ABS(dVar12 / local_4a0))) {
      iVar1 = n;
      if (iVar9 < 500) {
        doFrancis(&local_4b8._M_head_impl,&local_4b0,&local_4c0._M_head_impl,n);
        iVar9 = iVar9 + 1;
      }
      else {
        bVar2 = false;
        iVar9 = iVar9 + 1;
      }
    }
    n = iVar1;
  } while (bVar2);
  lVar11 = 0;
  lVar10 = 0;
  do {
    iVar9 = (int)lVar10;
    local_4a0 = BidiagonalMatrix::operator()(&local_4b0,iVar9,iVar9);
    dVar12 = BidiagonalMatrix::operator()(&local_4b0,iVar9,iVar9);
    if (0.0 <= local_4a0) {
      local_3a8[lVar10] = dVar12;
    }
    else {
      local_3a8[lVar10] = -dVar12;
      lVar8 = 0;
      do {
        *(ulong *)((long)local_4c0._M_head_impl.pBlock + lVar8 + lVar11) =
             *(ulong *)((long)local_4c0._M_head_impl.pBlock + lVar8 + lVar11) ^ 0x8000000000000000;
        lVar8 = lVar8 + 400;
      } while (lVar8 != 20000);
    }
    lVar10 = lVar10 + 1;
    lVar11 = lVar11 + 8;
  } while (lVar10 != 0x32);
  uVar5 = 0;
  bVar2 = false;
  do {
    local_498[uVar5] = (int)uVar5;
    bVar3 = !bVar2;
    bVar2 = true;
    if (bVar3) {
      if (uVar5 < 0x31) {
        bVar2 = local_3a8[uVar5] <= local_3a8[uVar5 + 1] && local_3a8[uVar5 + 1] != local_3a8[uVar5]
        ;
      }
      else {
        bVar2 = false;
      }
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x3c);
  if (bVar2) {
    std::
    __introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<singular::Svd<60,50>::decomposeUSV(singular::Matrix<60,50>const&)::_lambda(int,int)_1_>>
              (local_498,local_498 + 0x32,10,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kikuomax[P]singular_src_singular_Svd_h:138:37)>
                )local_3a8);
    std::
    __final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<singular::Svd<60,50>::decomposeUSV(singular::Matrix<60,50>const&)::_lambda(int,int)_1_>>
              (local_498,local_498 + 0x32,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kikuomax[P]singular_src_singular_Svd_h:138:37)>
                )local_3a8);
    lVar10 = 0;
    do {
      *(double *)((long)local_218 + lVar10 * 2) = local_3a8[*(int *)((long)local_498 + lVar10)];
      lVar10 = lVar10 + 4;
    } while (lVar10 != 200);
    pdVar6 = (double *)operator_new__(0x7080);
    lVar10 = 0;
    pdVar4 = pdVar6;
    do {
      iVar9 = local_498[lVar10];
      lVar11 = 0;
      do {
        *(undefined8 *)((long)pdVar4 + lVar11) =
             *(undefined8 *)((long)local_4b8._M_head_impl.pBlock + lVar11 + (long)iVar9 * 8);
        lVar11 = lVar11 + 0x1e0;
      } while ((int)lVar11 != 0x7080);
      lVar10 = lVar10 + 1;
      pdVar4 = pdVar4 + 1;
    } while (lVar10 != 0x3c);
    __dest = (double *)operator_new__(400);
    memcpy(__dest,local_218,400);
    pdVar7 = (double *)operator_new__(20000);
    lVar10 = 0;
    pdVar4 = pdVar7;
    do {
      iVar9 = local_498[lVar10];
      lVar11 = 0;
      do {
        *(undefined8 *)((long)pdVar4 + lVar11) =
             *(undefined8 *)((long)local_4c0._M_head_impl.pBlock + lVar11 + (long)iVar9 * 8);
        lVar11 = lVar11 + 400;
      } while ((int)lVar11 != 20000);
      lVar10 = lVar10 + 1;
      pdVar4 = pdVar4 + 1;
    } while (lVar10 != 0x32);
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
    ).super__Tuple_impl<1UL,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>.
    super__Tuple_impl<2UL,_singular::Matrix<50,_50>_>.
    super__Head_base<2UL,_singular::Matrix<50,_50>,_false>._M_head_impl.pBlock = pdVar7;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
    ).super__Tuple_impl<1UL,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>.
    super__Head_base<1UL,_singular::DiagonalMatrix<60,_50>,_false>._M_head_impl.pBlock = __dest;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
    ).super__Head_base<0UL,_singular::Matrix<60,_60>,_false>._M_head_impl.pBlock = pdVar6;
  }
  else {
    pdVar4 = (double *)operator_new__(400);
    memcpy(pdVar4,local_3a8,400);
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
    ).super__Tuple_impl<1UL,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>.
    super__Tuple_impl<2UL,_singular::Matrix<50,_50>_>.
    super__Head_base<2UL,_singular::Matrix<50,_50>,_false>._M_head_impl.pBlock =
         (double *)local_4c0._M_head_impl.pBlock;
    local_4c0._M_head_impl.pBlock = (Matrix<50,_50>)(double *)0x0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
    ).super__Tuple_impl<1UL,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>.
    super__Head_base<1UL,_singular::DiagonalMatrix<60,_50>,_false>._M_head_impl.pBlock = pdVar4;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_singular::Matrix<60,_60>,_singular::DiagonalMatrix<60,_50>,_singular::Matrix<50,_50>_>
    ).super__Head_base<0UL,_singular::Matrix<60,_60>,_false>._M_head_impl.pBlock =
         (double *)local_4b8._M_head_impl.pBlock;
    local_4b8._M_head_impl.pBlock = (Matrix<60,_60>)(double *)0x0;
  }
  if (local_4b0.pBlock != (double *)0x0) {
    operator_delete__(local_4b0.pBlock);
  }
  if (local_4c0._M_head_impl.pBlock != (double *)0x0) {
    operator_delete__((void *)local_4c0._M_head_impl.pBlock);
  }
  if (local_4b8._M_head_impl.pBlock != (double *)0x0) {
    operator_delete__((void *)local_4b8._M_head_impl.pBlock);
  }
  return __return_storage_ptr__;
}

Assistant:

static USV decomposeUSV(const Matrix< M, N >& m) {
			// makes sure that M >= N
			// otherwise decomposes the transposed matrix
			if (M < N) {
				// A^T = V * S^T * U^T
				typename Svd< N, M >::USV usvT =
					Svd< N, M >::decomposeUSV(m.transpose());
				return std::make_tuple(
					std::move(std::get< 2 >(usvT)),
					std::get< 1 >(usvT).transpose(),
					std::move(std::get< 0 >(usvT)));
			}
			const int MAX_ITERATIONS = N * 10;
			// allocates matrices
			Matrix< M, M > u = Matrix< M, M >::identity();
			// Matrix< M, N > s = m.clone();
			Matrix< N, N > v = Matrix< N, N >::identity();
			// bidiagonalizes a given matrix
			BidiagonalMatrix m2 = bidiagonalize(u, m.clone(), v);
			// repeats Francis iteration
			int iteration = 0;
			int n = N;
			while (n >= 2) {
				// processes the n-1 x n-1 submatrix
				// if the current n x n submatrix has converged
				double bn = m2(n - 1, n - 1);
				if (bn == 0.0 || std::abs(m2(n - 2, n - 1) / bn) < 1.0e-15) {
					--n;
				} else {
					// aborts if too many iterations
					++iteration;
					if (iteration > MAX_ITERATIONS) {
						break;
					}
					doFrancis(u, m2, v, n);
				}
			}
			// copies the diagonal elements
			// and makes all singular values positive
			double ss[N];
			for (int i = 0; i < N; ++i) {
				if (m2(i, i) < 0) {
					ss[i] = -m2(i, i);
					// inverts the sign of the right singular vector
					Vector< double > vi = v.column(i);
					std::transform(
						vi.begin(), vi.end(), vi.begin(),
						[](double x) {
							return -x;
						});
				} else {
					ss[i] = m2(i, i);
				}
			}
			// sorts singular values in descending order if necessary
			int shuffle[M];  // M >= N
			bool sortNeeded = false;
			for (int i = 0; i < M; ++i) {
				shuffle[i] = i;
				sortNeeded = sortNeeded || (i < N - 1 && ss[i] < ss[i + 1]);
			}
			if (sortNeeded) {
				// shuffles the N (<= M) singular values
				std::sort(shuffle, shuffle + N, [&ss](int i, int j) {
					return ss[i] > ss[j];  // descending order
				});
				double ss2[M];
				std::transform(shuffle, shuffle + N, ss2, [&ss](int i) {
					return ss[i];
				});
				return std::make_tuple(u.shuffleColumns(shuffle),
									   DiagonalMatrix< M, N >(ss2),
									   v.shuffleColumns(shuffle));
			} else {
				return std::make_tuple(std::move(u),
									   DiagonalMatrix< M, N >(ss),
									   std::move(v));
			}
		}